

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.c
# Opt level: O1

uint64_t * pad(uint8_t *input,uint64_t input_length,SkeinSize_t state_size)

{
  uint64_t *__dest;
  uint uVar1;
  ulong uVar2;
  size_t __nmemb;
  
  __dest = (uint64_t *)input;
  if (((ulong)(input_length == 0) % (ulong)state_size & 1) == 0) {
    if (input_length == 0) {
      __nmemb = 0;
    }
    else {
      __nmemb = 0;
      uVar1 = state_size >> 3;
      do {
        uVar2 = (ulong)uVar1;
        __nmemb = __nmemb + 1;
        uVar1 = uVar1 + (state_size >> 3);
      } while (uVar2 < input_length);
    }
    __dest = (uint64_t *)calloc(__nmemb,(ulong)(state_size >> 3));
    memcpy(__dest,input,input_length);
    if (__dest == (uint64_t *)0x0) {
      perror("Error: Unable to allocate enough memory to pad input\n");
      __dest = (uint64_t *)0x0;
    }
    free(input);
  }
  return __dest;
}

Assistant:

uint64_t* pad(const uint8_t* input,
              const uint64_t input_length,
              const SkeinSize_t state_size)
{
    if(!input_length % state_size == 0) //Don't allocate any memory if the input text is already a padded size
    {
        uint64_t num_blocks = getNumBlocks(input_length, state_size);
        //allocate zero filled memory for the padded input
        uint64_t* pad = calloc(num_blocks, state_size/sizeof(uint64_t));

        //Copy the input into the padded buffer
        if(memcpy(pad, input, input_length) == NULL)
        {
            perror("Error: Unable to allocate enough memory to pad input\n");
            free((void*)input); //free the old buffer

            return NULL; //failed to pad buffer
        }
        free((void*)input); //free the old buffer

        return pad; //return the padded buffer
    }

    return (uint64_t*)input; //no padding necessary
}